

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3f69c::CtfSeeker::update(CtfSeeker *this,float currentTime,float elapsedTime)

{
  long *plVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  bool bVar4;
  undefined7 extraout_var;
  undefined1 *color;
  long lVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  float extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  uint extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  Vec3 VVar15;
  Vec3 local_168;
  Vec3 local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  float local_120;
  float local_11c;
  Vec3 local_118;
  undefined1 local_108 [12];
  float fStack_fc;
  uint local_ec;
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Vec3 local_d8;
  Vec3 local_c8;
  Vec3 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  Vec3 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined8 local_48;
  
  local_120 = elapsedTime;
  local_11c = currentTime;
  if (this->state == running) {
    local_168._0_8_ =
         (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                            .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle
                            .super_AbstractLocalSpace + 0x40))(this);
    local_168.z = elapsedTime;
    local_148._0_4_ =
         OpenSteer::Vec3::distance(&local_168,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter);
    fVar7 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                      super_SimpleVehicle_3.
                                      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                      .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                      super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
    if ((float)local_148._0_4_ < fVar7 + 1.5) {
      this->state = atGoal;
      goto LAB_0011b48f;
    }
    if (this->state != running) goto LAB_0011b48f;
    this->lastRunningTime = local_11c;
  }
  else {
LAB_0011b48f:
    elapsedTime = this->lastRunningTime + 4.0;
    if ((local_11c <= elapsedTime) ||
       (OpenSteer::OpenSteerDemo::queueDelayedResetPlugInXXX(), this->state != running)) {
      local_118.z = 0.0;
      local_118.x = 0.0;
      local_118.y = 0.0;
      fVar7 = local_120;
      OpenSteer::SimpleVehicle::applyBrakingForce((SimpleVehicle *)this,0.75,local_120);
      goto LAB_0011bfd2;
    }
  }
  local_118.z = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  fStack_a4 = (float)((ulong)uVar9 >> 0x20);
  local_a8 = (float)uVar9 * 8.0;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  uStack_74 = (uint)((ulong)uVar9 >> 0x20);
  local_78 = (float)uVar9 + (float)uVar9;
  uStack_70 = extraout_XMM0_Dc;
  uStack_6c = extraout_XMM0_Dd;
  local_168._0_8_ =
       (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_168.z = elapsedTime;
  VVar15 = OpenSteer::Vec3::operator-((Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,&local_168);
  local_98.z = VVar15.z;
  local_98._0_8_ = VVar15._0_8_;
  local_58 = OpenSteer::Vec3::length(&local_98);
  auVar14._8_8_ = 0;
  auVar14._0_4_ = local_98.x;
  auVar14._4_4_ = local_98.y;
  auVar2._4_4_ = local_58;
  auVar2._0_4_ = local_58;
  auVar2._8_4_ = local_58;
  auVar2._12_4_ = local_58;
  _local_e8 = divps(auVar14,auVar2);
  fVar10 = local_98.z / local_58;
  local_b8._0_8_ = local_e8;
  local_b8.z = fVar10;
  bVar4 = OpenSteer::
          SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
          ::isAside((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                     *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.5);
  local_88 = -local_78;
  fStack_84 = (float)(uStack_74 ^ 0x80000000);
  fStack_80 = (float)(uStack_70 ^ 0x80000000);
  fStack_7c = (float)(uStack_6c ^ 0x80000000);
  local_68 = local_78 * -2.0;
  local_ec = (uint)CONCAT71(extraout_var,1);
  fVar7 = local_78;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
    plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar5);
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    local_168._0_8_ = uVar9;
    local_168.z = fVar7;
    local_158._0_8_ = (**(code **)(*plVar1 + 0x40))(plVar1);
    local_158.z = fVar7;
    fVar7 = OpenSteer::Vec3::distance(&local_168,&local_158);
    local_148._0_4_ = fVar7 * 0.3;
    fVar7 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
    fVar7 = (float)local_148._0_4_ / fVar7;
    local_168._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar7,plVar1);
    local_168.z = fVar7;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    local_108._0_4_ = local_168.x - (float)uVar9;
    local_108._4_4_ = local_168.y - (float)((ulong)uVar9 >> 0x20);
    stack0xffffffffffffff00 = CONCAT44(0.0 - extraout_XMM0_Dd_00,0.0 - extraout_XMM0_Dc_00);
    fVar11 = (float)local_e8._0_4_ * (float)local_108._0_4_ +
             (float)local_e8._4_4_ * (float)local_108._4_4_;
    local_138._0_4_ = local_168.z - fVar7;
    _local_148 = ZEXT416((uint)(fVar10 * (local_168.z - fVar7) + fVar11));
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
    fVar7 = fVar11;
    local_48 = uVar9;
    fVar8 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationXZCircle((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                       this,fVar8,&local_168,(Color *)(anonymous_namespace)::clearPathColor,0x14);
    if ((local_88 < (float)local_148._0_4_) && ((float)local_148._0_4_ < local_58)) {
      local_158.z = (float)local_138._0_4_ - fVar10 * (float)local_148._0_4_;
      local_158.y = (float)local_108._4_4_ - (float)local_148._0_4_ * (float)local_e8._4_4_;
      local_158.x = (float)local_108._0_4_ - (float)local_148._0_4_ * (float)local_e8._0_4_;
      fVar8 = OpenSteer::Vec3::length(&local_158);
      fVar7 = local_a8;
      if (fVar8 < local_a8) {
        fVar7 = (float)local_108._4_4_ * local_48._4_4_;
        fVar12 = (float)local_48 * (float)local_108._0_4_;
        fVar11 = fVar11 * (float)local_138._0_4_;
        fVar8 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
        fVar8 = fVar8 + fVar11 + fVar12 + fVar7;
        fVar7 = local_68;
        if ((local_68 <= fVar8) && (local_88 <= fVar8 || !bVar4)) {
          local_c8._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_c8.z = fVar7;
          local_d8._0_8_ = (**(code **)(*plVar1 + 0x40))(plVar1);
          local_d8.z = fVar7;
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *
                         )this,&local_c8,&local_d8,(Color *)(anonymous_namespace)::clearPathColor);
          local_ec = 0;
        }
      }
    }
  }
  local_e8 = (undefined1  [8])
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x10))(this);
  uStack_e0 = extraout_XMM0_Dc_01;
  uStack_dc = extraout_XMM0_Dd_01;
  fVar7 = fVar7 * local_a8;
  fVar8 = fVar7;
  local_108._0_8_ =
       (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x30))(this);
  local_138._0_4_ = fVar8;
  local_108._8_4_ = extraout_XMM0_Dc_02;
  fStack_fc = extraout_XMM0_Dd_02;
  local_148 = (undefined1  [8])
              (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
  fStack_140 = (float)extraout_XMM0_Dc_03;
  fStack_13c = (float)extraout_XMM0_Dd_03;
  fVar8 = fVar8 - (float)local_138._0_4_ * local_78;
  local_138._0_4_ = fVar8;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xa0))(this,&local_b8)
  ;
  fVar10 = _DAT_00178118;
  local_58 = fVar8 * local_a8;
  local_148._0_4_ = (float)local_148._0_4_ - local_78 * (float)local_108._0_4_;
  local_148._4_4_ = (float)local_148._4_4_ - local_78 * (float)local_108._4_4_;
  fStack_140 = fStack_140 - local_78 * (float)local_108._8_4_;
  fStack_13c = fStack_13c - local_78 * fStack_fc;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  local_68 = (float)uVar9 * local_a8;
  fStack_64 = (float)((ulong)uVar9 >> 0x20) * local_a8;
  fStack_60 = extraout_XMM0_Dc_04 * local_a8;
  fStack_5c = extraout_XMM0_Dd_04 * local_a8;
  local_168.x = (float)local_148._0_4_ + local_68;
  local_168.y = (float)local_148._4_4_ + fStack_64;
  local_168.z = (float)local_138._0_4_ + local_58;
  local_108._0_8_ = (anonymous_namespace)::gHomeBaseCenter;
  stack0xffffffffffffff00 = 0;
  local_88 = (float)(anonymous_namespace)::gHomeBaseCenter + local_68;
  fStack_84 = (float)((ulong)(anonymous_namespace)::gHomeBaseCenter >> 0x20) + fStack_64;
  fStack_80 = fStack_60 + 0.0;
  fStack_7c = fStack_5c + 0.0;
  local_158.z = local_58 + _DAT_00178118;
  local_158.y = fStack_84;
  local_158.x = local_88;
  local_48._0_4_ = local_158.z;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_158,(Color *)(anonymous_namespace)::clearPathColor);
  local_168.z = (float)local_138._0_4_ - local_58;
  local_168.y = (float)local_148._4_4_ - fStack_64;
  local_168.x = (float)local_148._0_4_ - local_68;
  local_108._0_4_ = (float)local_108._0_4_ - local_68;
  local_108._4_4_ = (float)local_108._4_4_ - fStack_64;
  stack0xffffffffffffff00 = CONCAT44(fStack_fc - fStack_5c,(float)local_108._8_4_ - fStack_60);
  fVar10 = fVar10 - local_58;
  local_158.y = (float)local_108._4_4_;
  local_158.x = (float)local_108._0_4_;
  local_158.z = fVar10;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_158,(Color *)(anonymous_namespace)::clearPathColor);
  local_168.x = (float)local_108._0_4_;
  local_168.y = (float)local_108._4_4_;
  local_158.y = fStack_84;
  local_158.x = local_88;
  local_158.z = (float)local_48;
  local_168.z = fVar10;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_158,(Color *)(anonymous_namespace)::clearPathColor);
  fVar10 = (float)local_138._0_4_ - fVar7;
  local_168.y = (float)local_148._4_4_ - fStack_a4 * (float)local_e8._4_4_;
  local_168.x = (float)local_148._0_4_ - local_a8 * (float)local_e8._0_4_;
  local_158.x = local_a8 * (float)local_e8._0_4_ + (float)local_148._0_4_;
  local_158.y = fStack_a4 * (float)local_e8._4_4_ + (float)local_148._4_4_;
  local_158.z = (float)local_138._0_4_ + fVar7;
  local_168.z = fVar10;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_158,(Color *)(anonymous_namespace)::clearPathColor);
  uVar3 = local_ec;
  if ((local_ec & 1) == 0) {
    this->evading = true;
    fVar7 = 0.9;
  }
  else {
    this->evading = false;
    local_168._0_8_ =
         (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                            super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                            .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle
                            .super_AbstractLocalSpace + 0x40))(this);
    local_168.z = fVar10;
    local_148._0_4_ =
         OpenSteer::Vec3::distance((Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,&local_168);
    local_148._4_4_ = extraout_XMM0_Db;
    fStack_140 = (float)extraout_XMM0_Dc_05;
    fStack_13c = (float)extraout_XMM0_Dd_05;
    bVar4 = OpenSteer::
            SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
            ::isAhead((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                       *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.98);
    fVar10 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                       super_SimpleVehicle_3.
                                       super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                       .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                       super_AbstractVehicle.super_AbstractLocalSpace + 0xd8))(this)
    ;
    fVar7 = 0.9;
    if (bVar4) {
      uVar6 = -(uint)(2.0 <= (float)local_148._0_4_ / fVar10);
      fVar7 = (float)(~uVar6 & 0x3f666666 | uVar6 & 0x40000000);
    }
  }
  VVar15 = OpenSteer::
           SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
           ::steerToAvoidObstacles
                     ((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                       *)this,fVar7,(ObstacleGroup *)&(anonymous_namespace)::CtfBase::allObstacles);
  local_c8.z = VVar15.z;
  local_c8._0_8_ = VVar15._0_8_;
  bVar4 = OpenSteer::Vec3::operator!=(&local_c8,&OpenSteer::Vec3::zero);
  (this->super_CtfBase).avoiding = bVar4;
  if (bVar4) {
    local_118.x = local_c8.x;
    fVar7 = local_c8.y;
    local_118.z = local_c8.z;
  }
  else {
    VVar15 = OpenSteer::
             SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
             ::xxxsteerForSeek((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter);
    fVar10 = VVar15.z;
    fVar7 = VVar15.x;
    local_d8._0_8_ = VVar15._0_8_;
    uStack_e0 = extraout_XMM0_Dc_06;
    local_e8._0_4_ = local_d8.x;
    local_e8._4_4_ = local_d8.y;
    uStack_dc = extraout_XMM0_Dd_06;
    local_d8.z = fVar10;
    if ((uVar3 & 1) == 0) {
      local_168.x = 0.0;
      local_168.y = 0.0;
      local_168.z = 0.0;
      fVar8 = fVar10;
      for (lVar5 = 0; fVar11 = local_168.z, lVar5 != 0x20; lVar5 = lVar5 + 8) {
        plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar5);
        local_138 = (undefined1  [8])(**(code **)(*plVar1 + 0x40))(fVar7,plVar1);
        uStack_130 = extraout_XMM0_Dc_08;
        uStack_12c = extraout_XMM0_Dd_08;
        local_148._0_4_ = fVar8;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_158.x = (float)local_138._0_4_ - (float)uVar9;
        local_158.y = (float)local_138._4_4_ - (float)((ulong)uVar9 >> 0x20);
        local_158.z = (float)local_148._0_4_ - fVar8;
        local_148._0_4_ = OpenSteer::Vec3::length(&local_158);
        local_138._0_4_ = (float)local_148._0_4_ * 0.5;
        fVar7 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
        fVar7 = (float)local_138._0_4_ / fVar7;
        local_98._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar7,plVar1);
        local_98.z = fVar7;
        fVar7 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
        OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
        annotationXZCircle((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                            *)this,fVar7,&local_98,(Color *)(anonymous_namespace)::evadeColor,0x14);
        VVar15 = OpenSteer::
                 SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                 ::xxxsteerForFlee((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                    *)this,&local_98);
        fVar12 = VVar15.z;
        uStack_130 = extraout_XMM0_Dc_09;
        local_138 = (undefined1  [8])VVar15._0_8_;
        uStack_12c = extraout_XMM0_Dd_09;
        local_108._0_4_ = fVar12;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
        fVar13 = local_158.x * (float)uVar9;
        fVar7 = (float)((ulong)uVar9 >> 0x20) * local_158.y;
        fVar12 = fVar12 * local_158.z;
        fVar8 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                          super_SimpleVehicle_3.
                                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                          super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))
                                 (this);
        fVar11 = 4.0 / (float)local_148._0_4_;
        fVar7 = *(float *)(&DAT_00141ce8 + (ulong)(fVar8 * -2.0 < fVar12 + fVar13 + fVar7) * 4);
        local_b8.z = (float)local_108._0_4_ * fVar11 * fVar7;
        local_b8.y = fVar7 * fVar11 * (float)local_138._4_4_;
        local_b8.x = fVar7 * fVar11 * (float)local_138._0_4_;
        VVar15 = OpenSteer::Vec3::operator+=(&local_168,&local_b8);
        fVar8 = VVar15.z;
        fVar7 = VVar15.x;
      }
      fVar7 = local_168.x;
      local_108._0_4_ = local_168.x;
      local_108._4_4_ = local_168.y;
      stack0xffffffffffffff00 = 0;
      fVar8 = fVar10 + local_168.z;
      local_168.y = (float)local_e8._4_4_ + local_168.y;
      local_168.x = (float)local_e8._0_4_ + fVar7;
      local_168.z = fVar8;
      local_158._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
      local_158.z = fVar8;
      VVar15 = OpenSteer::limitMaxDeviationAngle(&local_168,0.707,&local_158);
      fVar7 = VVar15.z;
      fStack_140 = (float)extraout_XMM0_Dc_10;
      local_148 = (undefined1  [8])VVar15._0_8_;
      fStack_13c = (float)extraout_XMM0_Dd_10;
      local_138._0_4_ = fVar7;
      local_168._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_168.z = fVar7;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      fVar7 = fVar7 + fVar10;
      local_158.y = (float)((ulong)uVar9 >> 0x20) + (float)local_e8._4_4_;
      local_158.x = (float)uVar9 + (float)local_e8._0_4_;
      local_158.z = fVar7;
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_168,&local_158,(Color *)OpenSteer::gRed);
      local_168._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_168.z = fVar7;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      fVar7 = fVar7 + fVar11;
      local_158.y = (float)((ulong)uVar9 >> 0x20) + (float)local_108._4_4_;
      local_158.x = (float)uVar9 + (float)local_108._0_4_;
      local_158.z = fVar7;
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_168,&local_158,(Color *)OpenSteer::gGreen);
      local_168._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_168.z = fVar7;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_158.z = (float)local_138._0_4_ * 0.2 + fVar7;
      local_158.y = (float)local_148._4_4_ * 0.2 + (float)((ulong)uVar9 >> 0x20);
      local_158.x = (float)local_148._0_4_ * 0.2 + (float)uVar9;
      color = (anonymous_namespace)::evadeColor;
    }
    else {
      local_168._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
      local_168.z = fVar10;
      VVar15 = OpenSteer::limitMaxDeviationAngle(&local_d8,0.707,&local_168);
      fVar7 = VVar15.z;
      fStack_140 = (float)extraout_XMM0_Dc_07;
      local_148 = (undefined1  [8])VVar15._0_8_;
      fStack_13c = (float)extraout_XMM0_Dd_07;
      local_138._0_4_ = fVar7;
      local_168._0_8_ =
           (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                              super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                              .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                              super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_168.z = fVar7;
      uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
      local_158.z = (float)local_138._0_4_ * 0.2 + fVar7;
      local_158.y = (float)local_148._4_4_ * 0.2 + (float)((ulong)uVar9 >> 0x20);
      local_158.x = (float)local_148._0_4_ * 0.2 + (float)uVar9;
      color = (anonymous_namespace)::seekColor;
    }
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                   &local_168,&local_158,(Color *)color);
    local_118.x = (float)local_148._0_4_;
    fVar7 = (float)local_148._4_4_;
    local_118.z = (float)local_138._0_4_;
  }
  local_118.y = fVar7;
LAB_0011bfd2:
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_118,local_120);
  OpenSteer::SimpleVehicle::annotationVelocityAcceleration((SimpleVehicle *)this);
  local_168._0_8_ =
       (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_168.z = fVar7;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,local_11c,&local_168);
  return;
}

Assistant:

void CtfSeeker::update (const float currentTime, const float elapsedTime)
    {
        // do behavioral state transitions, as needed
        updateState (currentTime);

        // determine and apply steering/braking forces
        Vec3 steer (0, 0, 0);
        if (state == running)
        {
            steer = steeringForSeeker ();
        }
        else
        {
            applyBrakingForce (gBrakingRate, elapsedTime);
        }
        applySteeringForce (steer, elapsedTime);

        // annotation
        annotationVelocityAcceleration ();
        recordTrailVertex (currentTime, position());
    }